

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool Fossilize::Hashing::compute_hash_stage
               (StateRecorder *recorder,Hasher *h,VkPipelineShaderStageCreateInfo *stage)

{
  char *str;
  bool bVar1;
  VkShaderModuleCreateInfo *create_info;
  ulong uVar2;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *info;
  VkShaderModule module;
  VkStructureType sType;
  Hash hash;
  ulong local_30;
  
  str = stage->pName;
  if (str == (char *)0x0) {
LAB_0010bb96:
    bVar1 = false;
  }
  else {
    h->h = h->h * 0x100000001b3 ^ (ulong)stage->flags;
    Hasher::string(h,str);
    h->h = h->h * 0x100000001b3 ^ (ulong)stage->stage;
    module = stage->module;
    if (module == (VkShaderModule)0x0) {
      sType = (VkStructureType)stage->pNext;
      create_info = find_pnext<VkShaderModuleCreateInfo>(sType,(void *)0x0);
      if (create_info == (VkShaderModuleCreateInfo *)0x0) {
        info = find_pnext<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>(sType,module);
        if (info == (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0) goto LAB_0010bb96;
        bVar1 = StateRecorder::get_hash_for_shader_module(recorder,info,&local_30);
        goto LAB_0010bb92;
      }
      compute_hash_shader_module(create_info,&local_30);
    }
    else {
      bVar1 = StateRecorder::get_hash_for_shader_module(recorder,module,&local_30);
LAB_0010bb92:
      if (bVar1 == false) goto LAB_0010bb96;
    }
    uVar2 = (local_30 & 0xffffffff ^ h->h * 0x100000001b3) * 0x100000001b3 ^ local_30 >> 0x20;
    h->h = uVar2;
    if (stage->pSpecializationInfo == (VkSpecializationInfo *)0x0) {
      h->h = uVar2 * 0x100000001b3;
    }
    else {
      hash_specialization_info(h,stage->pSpecializationInfo);
    }
    bVar1 = hash_pnext_chain(recorder,h,stage->pNext,(DynamicStateInfo *)0x0,0);
  }
  return bVar1;
}

Assistant:

static bool compute_hash_stage(const StateRecorder &recorder, Hasher &h, const VkPipelineShaderStageCreateInfo &stage)
{
	if (!stage.pName)
		return false;

	h.u32(stage.flags);
	h.string(stage.pName);
	h.u32(stage.stage);

	Hash hash;
	if (stage.module != VK_NULL_HANDLE)
	{
		if (!recorder.get_hash_for_shader_module(stage.module, &hash))
			return false;
	}
	else if (const auto *module = find_pnext<VkShaderModuleCreateInfo>(
			VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO, stage.pNext))
	{
		if (!compute_hash_shader_module(*module, &hash))
			return false;
	}
	else if (const auto *identifier = find_pnext<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>(
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT, stage.pNext))
	{
		if (!recorder.get_hash_for_shader_module(identifier, &hash))
			return false;
	}
	else
		return false;

	h.u64(hash);

	if (stage.pSpecializationInfo)
		hash_specialization_info(h, *stage.pSpecializationInfo);
	else
		h.u32(0);

	if (!hash_pnext_chain(&recorder, h, stage.pNext, nullptr, 0))
		return false;

	return true;
}